

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

PerThreadSynch *
absl::lts_20250127::Enqueue(PerThreadSynch *head,SynchWaitParams *waitp,intptr_t mu,int flags)

{
  PerThreadSynch *x;
  long lVar1;
  bool bVar2;
  uint uVar3;
  PerThreadSynch *pPVar4;
  pthread_t __target_thread;
  double dVar5;
  bool local_91;
  byte local_79;
  char *absl_raw_log_internal_basename_2;
  PerThreadSynch *advance_to;
  PerThreadSynch *enqueue_after;
  char *absl_raw_log_internal_basename_1;
  sched_param local_50;
  int err;
  sched_param param;
  int policy;
  int64_t now_cycles;
  char *absl_raw_log_internal_basename;
  PerThreadSynch *s;
  int flags_local;
  intptr_t mu_local;
  SynchWaitParams *waitp_local;
  PerThreadSynch *head_local;
  
  if (waitp->cv_word == (atomic<long> *)0x0) {
    x = waitp->thread;
    local_79 = 1;
    if ((x->waitp != (SynchWaitParams *)0x0) && (local_79 = 1, x->waitp != waitp)) {
      local_79 = x->suppress_fatal_errors;
    }
    if (((local_79 ^ 0xff) & 1) != 0) {
      raw_log_internal::RawLog
                (kFatal,"mutex.cc",0x3a9,"Check %s failed: %s",
                 "s->waitp == nullptr || s->waitp == waitp || s->suppress_fatal_errors",
                 "detected illegal recursion into Mutex code");
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                    ,0x3a9,
                    "PerThreadSynch *absl::Enqueue(PerThreadSynch *, SynchWaitParams *, intptr_t, int)"
                   );
    }
    x->waitp = waitp;
    x->skip = (PerThreadSynch *)0x0;
    x->may_skip = true;
    x->wake = false;
    x->cond_waiter = (flags & 2U) != 0;
    if ((flags & 4U) == 0) {
      pPVar4 = Synch_GetPerThread();
      if (x != pPVar4) {
        __assert_fail("s == Synch_GetPerThread()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                      ,0x3b1,
                      "PerThreadSynch *absl::Enqueue(PerThreadSynch *, SynchWaitParams *, intptr_t, int)"
                     );
      }
      _param = base_internal::CycleClock::Now();
      if (x->next_priority_read_cycles < _param) {
        __target_thread = pthread_self();
        uVar3 = pthread_getschedparam(__target_thread,&err,&local_50);
        lVar1 = _param;
        if (uVar3 == 0) {
          x->priority = local_50.__sched_priority;
          dVar5 = base_internal::CycleClock::Frequency();
          x->next_priority_read_cycles = lVar1 + (long)dVar5;
        }
        else {
          raw_log_internal::RawLog
                    (kError,"mutex.cc",0x3bb,"pthread_getschedparam failed: %d",(ulong)uVar3);
        }
      }
    }
    waitp_local = (SynchWaitParams *)x;
    if (head == (PerThreadSynch *)0x0) {
      x->next = x;
      x->readers = mu;
      x->maybe_unlocking = false;
    }
    else {
      advance_to = (PerThreadSynch *)0x0;
      if (head->priority < x->priority) {
        absl_raw_log_internal_basename_2 = (char *)head;
        if ((head->maybe_unlocking & 1U) == 0) {
          do {
            advance_to = (PerThreadSynch *)absl_raw_log_internal_basename_2;
            absl_raw_log_internal_basename_2 =
                 (char *)Skip(*(PerThreadSynch **)absl_raw_log_internal_basename_2);
          } while (x->priority <= ((PerThreadSynch *)absl_raw_log_internal_basename_2)->priority);
        }
        else if ((waitp->how == (MuHow)kExclusiveS) && (waitp->cond == (Condition *)0x0)) {
          advance_to = head;
        }
      }
      if (advance_to == (PerThreadSynch *)0x0) {
        if ((((flags & 1U) == 0) || (x->priority < head->next->priority)) ||
           (((head->maybe_unlocking & 1U) != 0 &&
            ((waitp->how != (MuHow)kExclusiveS ||
             (bVar2 = Condition::GuaranteedEqual(waitp->cond,(Condition *)0x0), !bVar2)))))) {
          x->next = head->next;
          head->next = x;
          x->readers = head->readers;
          x->maybe_unlocking = (bool)(head->maybe_unlocking & 1);
          if (((head->may_skip & 1U) != 0) && (bVar2 = MuEquivalentWaiter(head,x), bVar2)) {
            head->skip = x;
          }
        }
        else {
          x->next = head->next;
          head->next = x;
          bVar2 = MuEquivalentWaiter(x,x->next);
          waitp_local = (SynchWaitParams *)head;
          if (bVar2) {
            x->skip = x->next;
          }
        }
      }
      else {
        x->next = advance_to->next;
        advance_to->next = x;
        local_91 = true;
        if (advance_to->skip != (PerThreadSynch *)0x0) {
          local_91 = MuEquivalentWaiter(advance_to,x);
        }
        if (((local_91 ^ 0xffU) & 1) != 0) {
          raw_log_internal::RawLog
                    (kFatal,"mutex.cc",0x3f2,"Check %s failed: %s",
                     "enqueue_after->skip == nullptr || MuEquivalentWaiter(enqueue_after, s)",
                     "Mutex Enqueue failure");
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                        ,0x3f2,
                        "PerThreadSynch *absl::Enqueue(PerThreadSynch *, SynchWaitParams *, intptr_t, int)"
                       );
        }
        if (((advance_to != head) && ((advance_to->may_skip & 1U) != 0)) &&
           (bVar2 = MuEquivalentWaiter(advance_to,advance_to->next), bVar2)) {
          advance_to->skip = advance_to->next;
        }
        bVar2 = MuEquivalentWaiter(x,x->next);
        waitp_local = (SynchWaitParams *)head;
        if (bVar2) {
          x->skip = x->next;
        }
      }
    }
    std::atomic<absl::lts_20250127::base_internal::PerThreadSynch::State>::store
              (&x->state,kQueued,memory_order_relaxed);
    head_local = (PerThreadSynch *)waitp_local;
  }
  else {
    CondVarEnqueue(waitp);
    head_local = head;
  }
  return head_local;
}

Assistant:

static PerThreadSynch* Enqueue(PerThreadSynch* head, SynchWaitParams* waitp,
                               intptr_t mu, int flags) {
  // If we have been given a cv_word, call CondVarEnqueue() and return
  // the previous head of the Mutex waiter queue.
  if (waitp->cv_word != nullptr) {
    CondVarEnqueue(waitp);
    return head;
  }

  PerThreadSynch* s = waitp->thread;
  ABSL_RAW_CHECK(
      s->waitp == nullptr ||    // normal case
          s->waitp == waitp ||  // Fer()---transfer from condition variable
          s->suppress_fatal_errors,
      "detected illegal recursion into Mutex code");
  s->waitp = waitp;
  s->skip = nullptr;   // maintain skip invariant (see above)
  s->may_skip = true;  // always true on entering queue
  s->wake = false;     // not being woken
  s->cond_waiter = ((flags & kMuIsCond) != 0);
#ifdef ABSL_HAVE_PTHREAD_GETSCHEDPARAM
  if ((flags & kMuIsFer) == 0) {
    assert(s == Synch_GetPerThread());
    int64_t now_cycles = CycleClock::Now();
    if (s->next_priority_read_cycles < now_cycles) {
      // Every so often, update our idea of the thread's priority.
      // pthread_getschedparam() is 5% of the block/wakeup time;
      // CycleClock::Now() is 0.5%.
      int policy;
      struct sched_param param;
      const int err = pthread_getschedparam(pthread_self(), &policy, &param);
      if (err != 0) {
        ABSL_RAW_LOG(ERROR, "pthread_getschedparam failed: %d", err);
      } else {
        s->priority = param.sched_priority;
        s->next_priority_read_cycles =
            now_cycles + static_cast<int64_t>(CycleClock::Frequency());
      }
    }
  }
#endif
  if (head == nullptr) {         // s is the only waiter
    s->next = s;                 // it's the only entry in the cycle
    s->readers = mu;             // reader count is from mu word
    s->maybe_unlocking = false;  // no one is searching an empty list
    head = s;                    // s is new head
  } else {
    PerThreadSynch* enqueue_after = nullptr;  // we'll put s after this element
#ifdef ABSL_HAVE_PTHREAD_GETSCHEDPARAM
    if (s->priority > head->priority) {  // s's priority is above head's
      // try to put s in priority-fifo order, or failing that at the front.
      if (!head->maybe_unlocking) {
        // No unlocker can be scanning the queue, so we can insert into the
        // middle of the queue.
        //
        // Within a skip chain, all waiters have the same priority, so we can
        // skip forward through the chains until we find one with a lower
        // priority than the waiter to be enqueued.
        PerThreadSynch* advance_to = head;  // next value of enqueue_after
        do {
          enqueue_after = advance_to;
          // (side-effect: optimizes skip chain)
          advance_to = Skip(enqueue_after->next);
        } while (s->priority <= advance_to->priority);
        // termination guaranteed because s->priority > head->priority
        // and head is the end of a skip chain
      } else if (waitp->how == kExclusive && waitp->cond == nullptr) {
        // An unlocker could be scanning the queue, but we know it will recheck
        // the queue front for writers that have no condition, which is what s
        // is, so an insert at front is safe.
        enqueue_after = head;  // add after head, at front
      }
    }
#endif
    if (enqueue_after != nullptr) {
      s->next = enqueue_after->next;
      enqueue_after->next = s;

      // enqueue_after can be: head, Skip(...), or cur.
      // The first two imply enqueue_after->skip == nullptr, and
      // the last is used only if MuEquivalentWaiter(s, cur).
      // We require this because clearing enqueue_after->skip
      // is impossible; enqueue_after's predecessors might also
      // incorrectly skip over s if we were to allow other
      // insertion points.
      ABSL_RAW_CHECK(enqueue_after->skip == nullptr ||
                         MuEquivalentWaiter(enqueue_after, s),
                     "Mutex Enqueue failure");

      if (enqueue_after != head && enqueue_after->may_skip &&
          MuEquivalentWaiter(enqueue_after, enqueue_after->next)) {
        // enqueue_after can skip to its new successor, s
        enqueue_after->skip = enqueue_after->next;
      }
      if (MuEquivalentWaiter(s, s->next)) {  // s->may_skip is known to be true
        s->skip = s->next;                   // s may skip to its successor
      }
    } else if ((flags & kMuHasBlocked) &&
               (s->priority >= head->next->priority) &&
               (!head->maybe_unlocking ||
                (waitp->how == kExclusive &&
                 Condition::GuaranteedEqual(waitp->cond, nullptr)))) {
      // This thread has already waited, then was woken, then failed to acquire
      // the mutex and now tries to requeue. Try to requeue it at head,
      // otherwise it can suffer bad latency (wait whole queue several times).
      // However, we need to be conservative. First, we need to ensure that we
      // respect priorities. Then, we need to be careful to not break wait
      // queue invariants: we require either that unlocker is not scanning
      // the queue or that the current thread is a writer with no condition
      // (unlocker will recheck the queue for such waiters).
      s->next = head->next;
      head->next = s;
      if (MuEquivalentWaiter(s, s->next)) {  // s->may_skip is known to be true
        s->skip = s->next;                   // s may skip to its successor
      }
    } else {  // enqueue not done any other way, so
              // we're inserting s at the back
      // s will become new head; copy data from head into it
      s->next = head->next;  // add s after head
      head->next = s;
      s->readers = head->readers;  // reader count is from previous head
      s->maybe_unlocking = head->maybe_unlocking;  // same for unlock hint
      if (head->may_skip && MuEquivalentWaiter(head, s)) {
        // head now has successor; may skip
        head->skip = s;
      }
      head = s;  // s is new head
    }
  }
  s->state.store(PerThreadSynch::kQueued, std::memory_order_relaxed);
  return head;
}